

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::HugeintToDecimalCast<duckdb::hugeint_t>
          (duckdb *this,hugeint_t input,hugeint_t *result,CastParameters *parameters,uint8_t width,
          uint8_t scale)

{
  bool bVar1;
  long lVar2;
  uchar params_2;
  undefined3 in_register_00000089;
  uint uVar3;
  uint uVar4;
  hugeint_t hVar5;
  string error;
  hugeint_t max_width;
  allocator local_a9;
  hugeint_t local_a8;
  hugeint_t local_98;
  hugeint_t local_78;
  string local_68;
  string local_48 [32];
  
  uVar3 = CONCAT31(in_register_00000089,width);
  local_a8.upper = input.lower;
  lVar2 = (((ulong)parameters & 0xffffffff) - (ulong)uVar3) * 0x10;
  local_78.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar2);
  local_78.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar2 + 8);
  uVar4 = uVar3;
  local_a8.lower = (uint64_t)this;
  bVar1 = hugeint_t::operator>=(&local_a8,&local_78);
  params_2 = (uchar)uVar4;
  if (!bVar1) {
    local_98 = hugeint_t::operator-(&local_78);
    bVar1 = hugeint_t::operator<=(&local_a8,&local_98);
    if (!bVar1) {
      hVar5 = hugeint_t::operator*(&local_a8,(hugeint_t *)(Hugeint::POWERS_OF_TEN + (uVar3 << 4)));
      hVar5 = Hugeint::Cast<duckdb::hugeint_t>(hVar5);
      *(hugeint_t *)input.upper = hVar5;
      return true;
    }
  }
  ::std::__cxx11::string::string(local_48,"Could not cast value %s to DECIMAL(%d,%d)",&local_a9);
  hugeint_t::ToString_abi_cxx11_(&local_68,&local_a8);
  StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
            ((string *)&local_98,(StringUtil *)local_48,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)parameters & 0xff),width,params_2);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string(local_48);
  HandleCastError::AssignError((string *)&local_98,(CastParameters *)result);
  ::std::__cxx11::string::~string((string *)&local_98);
  return false;
}

Assistant:

bool HugeintToDecimalCast(hugeint_t input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	if (input >= max_width || input <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", input.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Hugeint::Cast<DST>(input * Hugeint::POWERS_OF_TEN[scale]);
	return true;
}